

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Sin::Sin(Sin *this)

{
  Interval local_78;
  Interval local_60;
  allocator<char> local_31;
  string local_30;
  Sin *local_10;
  Sin *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"sin",&local_31);
  tcu::Interval::Interval(&local_60,-1.0);
  tcu::Interval::Interval(&local_78,1.0);
  TrigFunc::TrigFunc(&this->super_TrigFunc,&local_30,deSin,&local_60,&local_78);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_TrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__Sin_032ddd10;
  return;
}

Assistant:

Sin			(void) : TrigFunc("sin", deSin, -1.0, 1.0) {}